

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O1

TestResult *
JsonTest::checkEqual<int,unsigned_long>
          (TestResult *result,int expected,unsigned_long actual,char *file,uint line,char *expr)

{
  TestResult *pTVar1;
  unsigned_long local_20;
  unsigned_long local_18;
  
  if ((long)expected != actual) {
    local_20 = actual;
    TestResult::addFailure(result,file,line,expr);
    pTVar1 = TestResult::operator<<(result,(char (*) [11])"Expected: ");
    local_18 = (long)expected;
    pTVar1 = TestResult::operator<<(pTVar1,&local_18);
    TestResult::operator<<(pTVar1,(char (*) [2])0x14a14b);
    pTVar1 = TestResult::operator<<(result,(char (*) [11])"Actual  : ");
    TestResult::operator<<(pTVar1,&local_20);
  }
  return result;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}